

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ChatClient client;
  allocator<char> local_10a;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  ChatServer local_c8;
  
  if (argc < 3) {
    ChatServer::ChatServer(&local_c8);
    Dashel::Hub::run();
    ChatServer::~ChatServer(&local_c8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,argv[1],&local_109);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,argv[2],&local_10a);
    ChatClient::ChatClient((ChatClient *)&local_c8,&local_e8,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    Dashel::Hub::run();
    ChatClient::~ChatClient((ChatClient *)&local_c8);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 2)
		{
			ChatClient client(argv[1], argv[2]);
			client.run();
		}
		else
		{
			ChatServer server;
			server.run();
		}
	}
	catch (const DashelException& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}